

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy.cpp
# Opt level: O2

QNetworkProxy __thiscall QGlobalNetworkProxy::applicationProxy(QGlobalNetworkProxy *this)

{
  QGlobalNetworkProxy *in_RSI;
  long in_FS_OFFSET;
  QNetworkProxyQuery QStack_48;
  QArrayDataPointer<QNetworkProxy> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QNetworkProxyQuery::QNetworkProxyQuery(&QStack_48);
  proxyForQuery((QList<QNetworkProxy> *)&local_40,in_RSI,&QStack_48);
  QNetworkProxy::QNetworkProxy((QNetworkProxy *)this,local_40.ptr);
  QArrayDataPointer<QNetworkProxy>::~QArrayDataPointer(&local_40);
  QNetworkProxyQuery::~QNetworkProxyQuery(&QStack_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QSharedDataPointer<QNetworkProxyPrivate>)(QSharedDataPointer<QNetworkProxyPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkProxy applicationProxy()
    {
        return proxyForQuery(QNetworkProxyQuery()).constFirst();
    }